

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gritlm.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  llama_token id;
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  llama_context *ctx;
  undefined8 uVar5;
  undefined8 uVar6;
  llama_vocab *vocab;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  llama_model_params *plVar10;
  llama_context_params *plVar11;
  int32_t *piVar12;
  ulong uVar13;
  byte bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<int> __l_01;
  int32_t local_15b8 [2];
  undefined4 uStack_15b0;
  undefined4 uStack_15ac;
  undefined4 local_15a8;
  undefined4 uStack_15a4;
  undefined4 uStack_15a0;
  undefined4 uStack_159c;
  undefined4 local_1598;
  undefined4 uStack_1594;
  undefined4 uStack_1590;
  undefined4 uStack_158c;
  int8_t *local_1588;
  allocator_type local_1535;
  float local_1534;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  documents;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  d_rep;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  q_rep;
  llama_batch bat;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  queries;
  string instruction;
  llama_model_params mparams;
  llama_context_params cparams;
  common_params params;
  
  bVar14 = 0;
  common_params::common_params(&params);
  bVar1 = common_params_parse(argc,argv,&params,LLAMA_EXAMPLE_COMMON,
                              (_func_void_int_char_ptr_ptr *)0x0);
  if (bVar1) {
    common_init();
    common_model_params_to_llama(&mparams,&params);
    common_context_params_to_llama(&cparams,&params);
    llama_backend_init();
    plVar10 = &mparams;
    piVar12 = local_15b8;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(ggml_backend_dev_t **)piVar12 = plVar10->devices;
      plVar10 = (llama_model_params *)((long)plVar10 + (ulong)bVar14 * -0x10 + 8);
      piVar12 = (int32_t *)((long)piVar12 + ((ulong)bVar14 * -2 + 1) * 8);
    }
    uVar4 = llama_model_load_from_file(params.model.path._M_dataplus._M_p);
    plVar11 = &cparams;
    piVar12 = local_15b8;
    for (lVar7 = 0xf; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined8 *)piVar12 = *(undefined8 *)plVar11;
      plVar11 = (llama_context_params *)((long)plVar11 + (ulong)bVar14 * -0x10 + 8);
      piVar12 = (int32_t *)((long)piVar12 + ((ulong)bVar14 * -2 + 1) * 8);
    }
    ctx = (llama_context *)llama_init_from_model(uVar4);
    llama_sampler_chain_default_params();
    uVar5 = llama_sampler_chain_init(0);
    uVar6 = llama_sampler_init_greedy();
    llama_sampler_chain_add(uVar5,uVar6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&instruction,
               "Given a scientific paper title, retrieve the paper\'s abstract",
               (allocator<char> *)&bat);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bat,"Bitcoin: A Peer-to-Peer Electronic Cash System",
               (allocator<char> *)&q_rep);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bat.n_seq_id,"Generative Representational Instruction Tuning",
               (allocator<char> *)&documents);
    __l._M_len = 2;
    __l._M_array = (iterator)&bat;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&queries,__l,(allocator_type *)&d_rep);
    lVar7 = 0x20;
    do {
      std::__cxx11::string::~string((string *)((long)&bat.n_tokens + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bat,
               "A purely peer-to-peer version of electronic cash would allow online payments to be sent directly from one party to another without going through a financial institution. Digital signatures provide part of the solution, but the main benefits are lost if a trusted third party is still required to prevent double-spending. We propose a solution to the double-spending problem using a peer-to-peer network. The network timestamps transactions by hashing them into an ongoing chain of hash-based proof-of-work, forming a record that cannot be changed without redoing the proof-of-work. The longest chain not only serves as proof of the sequence of events witnessed, but proof that it came from the largest pool of CPU power. As long as a majority of CPU power is controlled by nodes that are not cooperating to attack the network, they\'ll generate the longest chain and outpace attackers. The network itself requires minimal structure. Messages are broadcast on a best effort basis, and nodes can leave and rejoin the network at will, accepting the longest proof-of-work chain as proof of what happened while they were gone."
               ,(allocator<char> *)&q_rep);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bat.n_seq_id,
               "All text-based language problems can be reduced to either generation or embedding. Current models only perform well at one or the other. We introduce generative representational instruction tuning (GRIT) whereby a large language model is trained to handle both generative and embedding tasks by distinguishing between them through instructions. Compared to other open models, our resulting GritLM 7B sets a new state of the art on the Massive Text Embedding Benchmark (MTEB) and outperforms all models up to its size on a range of generative tasks. By scaling up further, GritLM 8X7B outperforms all open generative language models that we tried while still being among the best embedding models. Notably, we find that GRIT matches training on only generative or embedding data, thus we can unify both at no performance loss. Among other benefits, the unification via GRIT speeds up Retrieval-Augmented Generation (RAG) by > 60% for long documents, by no longer requiring separate retrieval and generation models. Models, code, etc. are freely available at https://github.com/ContextualAI/gritlm."
               ,(allocator<char> *)&d_rep);
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&bat;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&documents,__l_00,&local_1535);
    lVar7 = 0x20;
    do {
      std::__cxx11::string::~string((string *)((long)&bat.n_tokens + lVar7));
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != -0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&q_rep,"",(allocator<char> *)&local_1535);
    gritlm_instruction((string *)&bat,(string *)&q_rep);
    encode(&d_rep,ctx,&documents,(string *)&bat);
    std::__cxx11::string::~string((string *)&bat);
    std::__cxx11::string::~string((string *)&q_rep);
    gritlm_instruction((string *)&bat,&instruction);
    encode(&q_rep,ctx,&queries,(string *)&bat);
    std::__cxx11::string::~string((string *)&bat);
    iVar2 = llama_model_n_embd(uVar4);
    local_1534 = common_embd_similarity_cos
                           (((q_rep.
                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_start,
                            *(float **)
                             CONCAT44(d_rep.
                                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)d_rep.
                                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start),iVar2);
    fVar15 = common_embd_similarity_cos
                       (((q_rep.
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start,
                        *(float **)
                         (CONCAT44(d_rep.
                                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (int)d_rep.
                                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) + 0x18),iVar2);
    fVar16 = common_embd_similarity_cos
                       (q_rep.
                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        *(float **)
                         CONCAT44(d_rep.
                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)d_rep.
                                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start),iVar2);
    fVar17 = common_embd_similarity_cos
                       (q_rep.
                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        *(float **)
                         (CONCAT44(d_rep.
                                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (int)d_rep.
                                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) + 0x18),iVar2);
    printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n",
           SUB84((double)local_1534,0),
           ((queries.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
           ((documents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n",SUB84((double)fVar15,0),
           ((queries.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
           documents.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n",SUB84((double)fVar16,0),
           queries.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
           ((documents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n",SUB84((double)fVar17,0),
           queries.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
           documents.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&q_rep);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&d_rep);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&documents);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&queries);
    std::__cxx11::string::~string((string *)&instruction);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&q_rep,
               "<|user|>\nPlease write me a poem about my recent hike of Mt. Fuji at midnight in the style of Shakespeare.\n<|assistant|>\n"
               ,(allocator<char> *)&bat);
    queries.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&queries.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    queries.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queries.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    uVar6 = llama_get_model(ctx);
    vocab = (llama_vocab *)llama_model_get_vocab(uVar6);
    local_1534 = (float)llama_vocab_eos(vocab);
    llama_kv_self_clear(ctx);
    llama_set_embeddings(ctx,0);
    llama_set_causal_attn(ctx,1);
    uVar3 = llama_n_batch(ctx);
    llama_batch_init(&bat,uVar3,0);
    common_tokenize((vector<int,_std::allocator<int>_> *)&documents,vocab,(string *)&q_rep,false,
                    true);
    uVar13 = 0;
    while( true ) {
      common_batch_clear(&bat);
      uVar9 = (ulong)((long)documents.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)documents.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2;
      iVar2 = (int)uVar9;
      uVar9 = uVar9 & 0xffffffff;
      if (iVar2 < 1) {
        uVar9 = 0;
      }
      for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        id = *(llama_token *)
              ((long)&((documents.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar8 * 4);
        d_rep.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)&d_rep;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&instruction,__l_01,
                   (allocator_type *)&local_1535);
        common_batch_add(&bat,id,(int)uVar13 + (int)uVar8,
                         (vector<int,_std::allocator<int>_> *)&instruction,iVar2 - 1 == uVar8);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&instruction);
      }
      if (documents.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          documents.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        documents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             documents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      local_1588 = bat.logits;
      local_1598 = bat.n_seq_id._0_4_;
      uStack_1594 = bat.n_seq_id._4_4_;
      uStack_1590 = bat.seq_id._0_4_;
      uStack_158c = bat.seq_id._4_4_;
      local_15a8 = bat.embd._0_4_;
      uStack_15a4 = bat.embd._4_4_;
      uStack_15a0 = bat.pos._0_4_;
      uStack_159c = bat.pos._4_4_;
      local_15b8[0] = bat.n_tokens;
      local_15b8[1] = bat._4_4_;
      uStack_15b0 = bat.token._0_4_;
      uStack_15ac = bat.token._4_4_;
      llama_decode(ctx);
      d_rep.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           llama_sampler_sample(uVar5,ctx,bat.n_tokens + -1);
      if ((float)(int)d_rep.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == local_1534) break;
      common_token_to_piece_abi_cxx11_
                (&instruction,ctx,
                 (int)d_rep.
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,true);
      printf("%s",instruction._M_dataplus._M_p);
      fflush(_stdout);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&documents,(value_type_conflict *)&d_rep);
      std::__cxx11::string::append((string *)&queries);
      uVar13 = (uVar13 & 0xffffffff) + uVar8;
      std::__cxx11::string::~string((string *)&instruction);
    }
    putchar(10);
    local_1588 = bat.logits;
    local_1598 = bat.n_seq_id._0_4_;
    uStack_1594 = bat.n_seq_id._4_4_;
    uStack_1590 = bat.seq_id._0_4_;
    uStack_158c = bat.seq_id._4_4_;
    local_15a8 = bat.embd._0_4_;
    uStack_15a4 = bat.embd._4_4_;
    uStack_15a0 = bat.pos._0_4_;
    uStack_159c = bat.pos._4_4_;
    local_15b8[0] = bat.n_tokens;
    local_15b8[1] = bat._4_4_;
    uStack_15b0 = bat.token._0_4_;
    uStack_15ac = bat.token._4_4_;
    llama_batch_free();
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&documents);
    std::__cxx11::string::~string((string *)&queries);
    std::__cxx11::string::~string((string *)&q_rep);
    llama_sampler_free(uVar5);
    llama_free(ctx);
    llama_model_free(uVar4);
    llama_backend_free();
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
  }
  common_params::~common_params(&params);
  return iVar2;
}

Assistant:

int main(int argc, char * argv[]) {
    common_params params;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_COMMON)) {
        return 1;
    }

    common_init();

    llama_model_params mparams = common_model_params_to_llama(params);
    llama_context_params cparams = common_context_params_to_llama(params);

    llama_backend_init();

    llama_model * model = llama_model_load_from_file(params.model.path.c_str(), mparams);

    // create generation context
    llama_context * ctx = llama_init_from_model(model, cparams);

    auto sparams = llama_sampler_chain_default_params();

    sparams.no_perf = false;

    llama_sampler * smpl = llama_sampler_chain_init(sparams);

    llama_sampler_chain_add(smpl, llama_sampler_init_greedy());

    // ### Embedding/Representation ###
    // samples taken from: https://github.com/ContextualAI/gritlm#basic
    {
        const std::string instruction = "Given a scientific paper title, retrieve the paper's abstract";

        const std::vector<std::string> queries = {
            "Bitcoin: A Peer-to-Peer Electronic Cash System",
            "Generative Representational Instruction Tuning",
        };

        const std::vector<std::string> documents = {
            "A purely peer-to-peer version of electronic cash would allow online payments to be sent directly from one party to another without going through a financial institution. Digital signatures provide part of the solution, but the main benefits are lost if a trusted third party is still required to prevent double-spending. We propose a solution to the double-spending problem using a peer-to-peer network. The network timestamps transactions by hashing them into an ongoing chain of hash-based proof-of-work, forming a record that cannot be changed without redoing the proof-of-work. The longest chain not only serves as proof of the sequence of events witnessed, but proof that it came from the largest pool of CPU power. As long as a majority of CPU power is controlled by nodes that are not cooperating to attack the network, they'll generate the longest chain and outpace attackers. The network itself requires minimal structure. Messages are broadcast on a best effort basis, and nodes can leave and rejoin the network at will, accepting the longest proof-of-work chain as proof of what happened while they were gone.",
            "All text-based language problems can be reduced to either generation or embedding. Current models only perform well at one or the other. We introduce generative representational instruction tuning (GRIT) whereby a large language model is trained to handle both generative and embedding tasks by distinguishing between them through instructions. Compared to other open models, our resulting GritLM 7B sets a new state of the art on the Massive Text Embedding Benchmark (MTEB) and outperforms all models up to its size on a range of generative tasks. By scaling up further, GritLM 8X7B outperforms all open generative language models that we tried while still being among the best embedding models. Notably, we find that GRIT matches training on only generative or embedding data, thus we can unify both at no performance loss. Among other benefits, the unification via GRIT speeds up Retrieval-Augmented Generation (RAG) by > 60% for long documents, by no longer requiring separate retrieval and generation models. Models, code, etc. are freely available at https://github.com/ContextualAI/gritlm.",
        };

        // No need to add instruction for retrieval documents
        const std::vector<std::vector<float>> d_rep = encode(ctx, documents, gritlm_instruction(""));
        const std::vector<std::vector<float>> q_rep = encode(ctx, queries,   gritlm_instruction(instruction));

        const int n_embd = llama_model_n_embd(model);

        const float cosine_sim_q0_d0 = common_embd_similarity_cos(q_rep[0].data(), d_rep[0].data(), n_embd);
        const float cosine_sim_q0_d1 = common_embd_similarity_cos(q_rep[0].data(), d_rep[1].data(), n_embd);
        const float cosine_sim_q1_d0 = common_embd_similarity_cos(q_rep[1].data(), d_rep[0].data(), n_embd);
        const float cosine_sim_q1_d1 = common_embd_similarity_cos(q_rep[1].data(), d_rep[1].data(), n_embd);

        std::printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n", queries[0].c_str(), documents[0].c_str(), cosine_sim_q0_d0);
        std::printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n", queries[0].c_str(), documents[1].c_str(), cosine_sim_q0_d1);
        std::printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n", queries[1].c_str(), documents[0].c_str(), cosine_sim_q1_d0);
        std::printf("Cosine similarity between \"%.50s\" and \"%.50s\" is: %.3f\n", queries[1].c_str(), documents[1].c_str(), cosine_sim_q1_d1);
    }

    // ### Generation ###
    // GritLM models are not finetuned with system prompts, as you can just include system-like instructions together with your user instruction
    {
        const std::string prompt = "<|user|>\nPlease write me a poem about my recent hike of Mt. Fuji at midnight in the style of Shakespeare.\n<|assistant|>\n";
        std::string response = generate(ctx, smpl, prompt, true);
    }

    llama_sampler_free(smpl);
    llama_free(ctx);
    llama_model_free(model);
    llama_backend_free();

    return 0;
}